

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log.h
# Opt level: O2

void __thiscall
FIX::ScreenLog::ScreenLog
          (ScreenLog *this,SessionID *sessionID,bool incoming,bool outgoing,bool event)

{
  (this->super_Log)._vptr_Log = (_func_int **)&PTR__ScreenLog_001fd3d8;
  std::__cxx11::string::string((string *)&this->m_prefix,(string *)&sessionID->m_frozenString);
  UtcTimeStamp::now();
  this->m_incoming = incoming;
  this->m_outgoing = outgoing;
  this->m_event = event;
  return;
}

Assistant:

ScreenLog(const SessionID &sessionID, bool incoming, bool outgoing, bool event)
      : m_prefix(sessionID.toString()),
        m_incoming(incoming),
        m_outgoing(outgoing),
        m_event(event) {}